

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O1

void __thiscall irr::core::string<char>::append(string<char> *this,string<char> *other)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  iVar2 = this->used;
  iVar1 = iVar2 + -1;
  this->used = iVar1;
  uVar3 = other->used;
  if (this->allocated <= (int)(iVar2 + uVar3 + -2)) {
    reallocate(this,iVar1 + uVar3);
  }
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      this->array[uVar4 + (long)this->used] = other->array[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  this->used = this->used + uVar3;
  return;
}

Assistant:

void append(const string<T>& other)
	{
		--used;

		s32 len = other.size();
		
		if (used + len + 1 > allocated)
			reallocate((s32)used + (s32)len + 1);

		for (s32 l=0; l<len+1; ++l)
			array[l+used] = other[l];

		used = used + len + 1;
	}